

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O1

bool __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::CrossingParity
          (DegeneracyFinder *this,VertexId v0,VertexId v1,bool include_same)

{
  int iVar1;
  int iVar2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *pvVar3;
  pointer pVVar4;
  pointer piVar5;
  pointer ppVar6;
  char cVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  S2Point p1;
  S2Point p0;
  S2Point p0_ref;
  S2Point local_88;
  S2Point local_68;
  S2Point local_48;
  
  pvVar3 = this->g_->vertices_;
  lVar10 = (long)v0;
  pVVar4 = (pvVar3->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_68.c_[2] = pVVar4[lVar10].c_[2];
  pVVar4 = pVVar4 + lVar10;
  local_68.c_[0] = pVVar4->c_[0];
  local_68.c_[1] = pVVar4->c_[1];
  pVVar4 = (pvVar3->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_88.c_[2] = pVVar4[v1].c_[2];
  pVVar4 = pVVar4 + v1;
  local_88.c_[0] = pVVar4->c_[0];
  local_88.c_[1] = pVVar4->c_[1];
  S2::Ortho(&local_48,&local_68);
  piVar5 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[lVar10];
  iVar2 = piVar5[lVar10 + 1];
  bVar9 = 0;
  if (iVar1 != iVar2) {
    ppVar6 = (((this->out_).edges_)->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)iVar1 << 3;
    bVar9 = 0;
    do {
      iVar1 = *(int *)((long)&ppVar6->second + lVar8);
      cVar7 = include_same;
      if (iVar1 != v1) {
        cVar7 = s2pred::OrderedCCW(&local_48,
                                   (this->g_->vertices_->
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + iVar1,&local_88,
                                   &local_68);
      }
      bVar9 = bVar9 + cVar7;
      lVar8 = lVar8 + 8;
    } while ((long)iVar2 * 8 != lVar8);
  }
  piVar5 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[lVar10];
  iVar2 = piVar5[lVar10 + 1];
  if (iVar1 != iVar2) {
    piVar5 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)iVar1 << 2;
    do {
      iVar1 = (this->g_->edges_->
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start[*(int *)((long)piVar5 + lVar10)].first;
      cVar7 = include_same;
      if (iVar1 != v1) {
        cVar7 = s2pred::OrderedCCW(&local_48,
                                   (this->g_->vertices_->
                                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + iVar1,&local_88,
                                   &local_68);
      }
      bVar9 = bVar9 + cVar7;
      lVar10 = lVar10 + 4;
    } while ((long)iVar2 * 4 != lVar10);
  }
  return (bool)(bVar9 & 1);
}

Assistant:

bool DegeneracyFinder::CrossingParity(VertexId v0, VertexId v1,
                                      bool include_same) const {
  int crossings = 0;
  S2Point p0 = g_.vertex(v0);
  S2Point p1 = g_.vertex(v1);
  S2Point p0_ref = S2::Ortho(p0);
  for (const Edge& edge : out_.edges(v0)) {
    if (edge.second == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.second), p1, p0)) {
      ++crossings;
    }
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    Edge edge = g_.edge(e);
    if (edge.first == v1) {
      if (include_same) ++crossings;
    } else if (s2pred::OrderedCCW(p0_ref, g_.vertex(edge.first), p1, p0)) {
      ++crossings;
    }
  }
  return crossings & 1;
}